

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O1

int __thiscall IlmThread_2_5::ThreadPool::numThreads(ThreadPool *this)

{
  Data *pDVar1;
  int iVar2;
  
  pDVar1 = this->_data;
  LOCK();
  (pDVar1->provUsers).super___atomic_base<int>._M_i =
       (pDVar1->provUsers).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  iVar2 = (*((pDVar1->provider)._M_b._M_p)->_vptr_ThreadPoolProvider[2])();
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->provUsers).super___atomic_base<int>._M_i =
         (pDVar1->provUsers).super___atomic_base<int>._M_i + -1;
    UNLOCK();
  }
  return iVar2;
}

Assistant:

int
ThreadPool::numThreads () const
{
    return _data->getProvider ()->numThreads ();
}